

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O1

Vec_Int_t *
Rnm_ManRefine(Rnm_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vMap,int fPropFanout,int fNewRefinement,
             int fVerbose)

{
  size_t __size;
  Gia_Man_t *pGVar1;
  int iVar2;
  Rnm_Obj_t *pRVar3;
  Vec_Int_t *vSelect;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Vec_Int_t *__ptr;
  bool bVar10;
  timespec ts;
  timespec local_48;
  int local_34;
  
  local_34 = fNewRefinement;
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  p->nCalls = p->nCalls + 1;
  p->pCex = pCex;
  p->vMap = vMap;
  p->fPropFanout = fPropFanout;
  p->fVerbose = fVerbose;
  Rnm_ManCollect(p);
  lVar6 = (long)p->vObjs->nSize + (long)vMap->nSize + 1;
  p->nObjsFrame = (int)lVar6;
  lVar6 = ((long)pCex->iFrame + 1) * lVar6;
  iVar2 = (int)lVar6;
  p->nObjs = iVar2;
  if (p->nObjsAlloc < iVar2) {
    p->nObjsAlloc = iVar2 + 10000;
    __size = lVar6 * 4 + 40000;
    if (p->pObjs == (Rnm_Obj_t *)0x0) {
      pRVar3 = (Rnm_Obj_t *)malloc(__size);
    }
    else {
      pRVar3 = (Rnm_Obj_t *)realloc(p->pObjs,__size);
    }
    p->pObjs = pRVar3;
  }
  memset(p->pObjs,0,(long)p->nObjs << 2);
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  vSelect = (Vec_Int_t *)malloc(0x10);
  vSelect->nCap = 100;
  vSelect->nSize = 0;
  piVar4 = (int *)malloc(400);
  vSelect->pArray = piVar4;
  iVar2 = Rnm_ManSensitize(p);
  if (iVar2 != 0) {
    iVar2 = clock_gettime(3,&local_48);
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    p->timeFwd = p->timeFwd + lVar8 + lVar6;
    iVar2 = clock_gettime(3,&local_48);
    if (iVar2 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
    }
    p->nVisited = 0;
    pGVar1 = p->pGia;
    iVar2 = pGVar1->vCos->nSize;
    if (iVar2 <= pGVar1->nRegs) {
      __assert_fail("v < Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
    }
    if (iVar2 < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = *pGVar1->vCos->pArray;
    if (((long)iVar2 < 0) || (pGVar1->nObjs <= iVar2)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    Rnm_ManJustify_rec(p,pGVar1->pObjs + iVar2 +
                         -(ulong)((uint)*(undefined8 *)(pGVar1->pObjs + iVar2) & 0x1fffffff),
                       pCex->iFrame,vSelect);
    if (1 < (long)vSelect->nSize) {
      qsort(vSelect->pArray,(long)vSelect->nSize,4,Vec_IntSortCompare1);
      iVar2 = 1;
      if (1 < vSelect->nSize) {
        piVar4 = vSelect->pArray;
        lVar8 = 1;
        do {
          if (piVar4[lVar8] != piVar4[lVar8 + -1]) {
            lVar9 = (long)iVar2;
            iVar2 = iVar2 + 1;
            piVar4[lVar9] = piVar4[lVar8];
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vSelect->nSize);
      }
      vSelect->nSize = iVar2;
    }
    iVar2 = clock_gettime(3,&local_48);
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    p->timeBwd = p->timeBwd + lVar8 + lVar6;
  }
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  Rnm_ManVerifyUsingTerSim(p->pGia,p->pCex,p->vMap,p->vObjs,vSelect);
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeVer = p->timeVer + lVar8 + lVar6;
  if (0 < vSelect->nSize) {
    if (local_34 == 0) {
      pVVar5 = Rnm_ManFilterSelected(p,vSelect);
    }
    else {
      pVVar5 = Rnm_ManFilterSelectedNew(p,vSelect);
    }
    if (pVVar5->nSize < 1) {
      if (pVVar5->pArray != (int *)0x0) {
        free(pVVar5->pArray);
        pVVar5->pArray = (int *)0x0;
      }
      bVar10 = pVVar5 == (Vec_Int_t *)0x0;
      __ptr = pVVar5;
      pVVar5 = vSelect;
      if (bVar10) goto LAB_00612603;
    }
    else {
      __ptr = vSelect;
      if (vSelect->pArray != (int *)0x0) {
        free(vSelect->pArray);
        vSelect->pArray = (int *)0x0;
      }
    }
    free(__ptr);
    vSelect = pVVar5;
  }
LAB_00612603:
  Rnm_ManCleanValues(p);
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeTotal = p->timeTotal + lVar6 + lVar7;
  p->nRefines = p->nRefines + vSelect->nSize;
  return vSelect;
}

Assistant:

Vec_Int_t * Rnm_ManRefine( Rnm_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vMap, int fPropFanout, int fNewRefinement, int fVerbose )
{
    int fVerify = 1;
    Vec_Int_t * vGoodPPis, * vNewPPis;
    abctime clk, clk2 = Abc_Clock();
    int RetValue;
    p->nCalls++;
//    Gia_ManCleanValue( p->pGia );
    // initialize
    p->pCex = pCex;
    p->vMap = vMap;
    p->fPropFanout = fPropFanout;
    p->fVerbose    = fVerbose;
    // collects used objects
    Rnm_ManCollect( p );
    // initialize datastructure
    p->nObjsFrame = 1 + Vec_IntSize(vMap) + Vec_IntSize(p->vObjs);
    p->nObjs = p->nObjsFrame * (pCex->iFrame + 1);
    if ( p->nObjs > p->nObjsAlloc )
        p->pObjs = ABC_REALLOC( Rnm_Obj_t, p->pObjs, (p->nObjsAlloc = p->nObjs + 10000) );
    memset( p->pObjs, 0, sizeof(Rnm_Obj_t) * p->nObjs );
    // propagate priorities
    clk = Abc_Clock();
    vGoodPPis = Vec_IntAlloc( 100 );
    if ( Rnm_ManSensitize( p ) ) // the CEX is not a true CEX
    {
        p->timeFwd += Abc_Clock() - clk;
        // select refinement
        clk = Abc_Clock();
        p->nVisited = 0;
        Rnm_ManJustify_rec( p, Gia_ObjFanin0(Gia_ManPo(p->pGia, 0)), pCex->iFrame, vGoodPPis );
        RetValue = Vec_IntUniqify( vGoodPPis );
//        assert( RetValue == 0 );
        p->timeBwd += Abc_Clock() - clk;
    }

    // verify (empty) refinement
    // (only works when post-processing is not applied)
    if ( fVerify )
    {
        clk = Abc_Clock();
        Rnm_ManVerifyUsingTerSim( p->pGia, p->pCex, p->vMap, p->vObjs, vGoodPPis );
        p->timeVer += Abc_Clock() - clk;
    }

    // at this point array vGoodPPis contains the set of important PPIs
    if ( Vec_IntSize(vGoodPPis) > 0 ) // spurious CEX resulting in a non-trivial refinement 
    {
        // filter selected set
        if ( !fNewRefinement )  // default 
            vNewPPis = Rnm_ManFilterSelected( p, vGoodPPis );
        else // this is enabled when &gla is called with -r (&gla -r)
            vNewPPis = Rnm_ManFilterSelectedNew( p, vGoodPPis );

        // replace the PPI array if necessary
        if ( Vec_IntSize(vNewPPis) > 0 ) // something to select, replace current refinement 
            Vec_IntFree( vGoodPPis ), vGoodPPis = vNewPPis;
        else // if there is nothing to select, do not change the current refinement array
            Vec_IntFree( vNewPPis );
    }

    // clean values
    // we cannot do this before, because we need to remember what objects
    // belong to the abstraction when we do Rnm_ManFilterSelected()
    Rnm_ManCleanValues( p );

//    Vec_IntReverseOrder( vGoodPPis );
    p->timeTotal += Abc_Clock() - clk2;
    p->nRefines += Vec_IntSize(vGoodPPis);
    return vGoodPPis;
}